

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetanimator.cpp
# Opt level: O3

void __thiscall
QWidgetAnimator::animate(QWidgetAnimator *this,QWidget *widget,QRect *_final_geometry,bool animate)

{
  QWidgetData *pQVar1;
  long lVar2;
  int *piVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  QRect QVar8;
  Representation RVar9;
  QWidget *pQVar10;
  int iVar11;
  QStyle *pQVar12;
  QPropertyAnimation *this_00;
  ulong uVar13;
  undefined8 uVar14;
  undefined4 *puVar15;
  long lVar16;
  long in_FS_OFFSET;
  const_iterator cVar17;
  undefined1 auVar18 [16];
  code *local_90;
  ImplFn local_88;
  QObject local_80 [8];
  QRect local_78;
  QWidget *widget_local;
  anon_union_24_3_e3d07ef4_for_data local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = widget->data;
  if (animate) {
    iVar11 = (_final_geometry->x1).m_i;
  }
  else {
    iVar11 = (_final_geometry->x1).m_i;
  }
  if ((((_final_geometry->x2).m_i < iVar11) ||
      ((_final_geometry->y2).m_i < (_final_geometry->y1).m_i)) &&
     (((pQVar1->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
       super_QFlagsStorage<Qt::WindowType>.i & 1) == 0)) {
    local_78.x1.m_i = (pQVar1->crect).x1.m_i + ~(pQVar1->crect).x2.m_i + -500;
    local_78.y1.m_i = ((pQVar1->crect).y1.m_i - (pQVar1->crect).y2.m_i) + -0x1f5;
    local_78.x2.m_i = -0x1f5;
    local_78.y2.m_i = -0x1f5;
  }
  else {
    uVar4 = _final_geometry->x1;
    uVar5 = _final_geometry->y1;
    uVar6 = _final_geometry->x2;
    uVar7 = _final_geometry->y2;
    local_78.x1.m_i = uVar4;
    local_78.y1.m_i = uVar5;
    local_78.x2.m_i = uVar6;
    local_78.y2.m_i = uVar7;
  }
  widget_local = widget;
  pQVar12 = QWidget::style(widget);
  iVar11 = (**(code **)(*(long *)pQVar12 + 0xf0))(pQVar12,0x71,0,widget,0);
  if (iVar11 == 0) {
    QWidget::setGeometry(widget,&local_78);
    QMainWindowLayout::animationFinished(*(QMainWindowLayout **)(this + 0x18),widget);
  }
  else {
    cVar17 = QHash<QWidget*,QPointer<QPropertyAnimation>>::constFindImpl<QWidget*>
                       ((QHash<QWidget*,QPointer<QPropertyAnimation>> *)(this + 0x10),&widget_local)
    ;
    if (cVar17.i.d != (Data<QHashPrivate::Node<QWidget_*,_QPointer<QPropertyAnimation>_>_> *)0x0 ||
        cVar17.i.bucket != 0) {
      QVariantAnimation::endValue();
      auVar18 = ::QVariant::toRect();
      RVar9.m_i = local_78.y2.m_i;
      if (((local_78.x1.m_i == auVar18._0_4_) && (local_78.x2.m_i == auVar18._8_4_)) &&
         (local_78.y1.m_i == auVar18._4_4_)) {
        ::QVariant::~QVariant((QVariant *)&local_58);
        if (RVar9.m_i == auVar18._12_4_) goto LAB_003906bf;
      }
      else {
        ::QVariant::~QVariant((QVariant *)&local_58);
      }
    }
    this_00 = (QPropertyAnimation *)operator_new(0x10);
    pQVar10 = widget_local;
    QByteArray::QByteArray((QByteArray *)&local_58,"geometry",-1);
    QPropertyAnimation::QPropertyAnimation
              (this_00,&pQVar10->super_QObject,(QByteArray *)&local_58,&widget_local->super_QObject)
    ;
    if ((QArrayData *)local_58.shared != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_58.shared = *(int *)local_58.shared + -1;
      UNLOCK();
      if (*(int *)local_58.shared == 0) {
        QArrayData::deallocate((QArrayData *)local_58.shared,1,0x10);
      }
    }
    QVariantAnimation::setDuration((DeletionPolicy)this_00);
    QEasingCurve::QEasingCurve((QEasingCurve *)&local_58,InOutQuad);
    QVariantAnimation::setEasingCurve((QEasingCurve *)this_00);
    QEasingCurve::~QEasingCurve((QEasingCurve *)&local_58);
    QVar8.y1.m_i = local_78.y1.m_i;
    QVar8.x1.m_i = local_78.x1.m_i;
    QVar8.x2.m_i = local_78.x2.m_i;
    QVar8.y2.m_i = local_78.y2.m_i;
    ::QVariant::QVariant((QVariant *)&local_58,QVar8);
    QVariantAnimation::setEndValue((QVariant *)this_00);
    ::QVariant::~QVariant((QVariant *)&local_58);
    QHash<QWidget*,QPointer<QPropertyAnimation>>::tryEmplace_impl<QWidget*const&>
              ((TryEmplaceResult *)&local_58,
               (QHash<QWidget*,QPointer<QPropertyAnimation>> *)(this + 0x10),&widget_local);
    lVar16 = ((ulong)local_58._8_8_ >> 7) * 0x90;
    lVar2 = *(long *)(*(long *)(local_58.shared + 0x20) + 0x80 + lVar16);
    uVar13 = (ulong)*(byte *)((ulong)((uint)local_58._8_8_ & 0x7f) +
                             *(long *)(local_58.shared + 0x20) + lVar16);
    uVar14 = QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)this_00);
    piVar3 = *(int **)(lVar2 + 8 + uVar13 * 0x18);
    *(undefined8 *)(lVar2 + 8 + uVar13 * 0x18) = uVar14;
    *(QPropertyAnimation **)(lVar2 + 0x10 + uVar13 * 0x18) = this_00;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        operator_delete(piVar3);
      }
    }
    local_90 = animationFinished;
    local_88 = (ImplFn)0x0;
    local_58.shared = (PrivateShared *)QAbstractAnimation::finished;
    local_58._8_8_ = 0;
    puVar15 = (undefined4 *)operator_new(0x20);
    *puVar15 = 1;
    *(code **)(puVar15 + 2) =
         QtPrivate::QCallableObject<void_(QWidgetAnimator::*)(),_QtPrivate::List<>,_void>::impl;
    *(code **)(puVar15 + 4) = animationFinished;
    *(undefined8 *)(puVar15 + 6) = 0;
    QObject::connectImpl
              (local_80,(void **)this_00,(QObject *)&local_58,(void **)this,
               (QSlotObjectBase *)&local_90,(ConnectionType)puVar15,(int *)0x0,(QMetaObject *)0x0);
    QMetaObject::Connection::~Connection((Connection *)local_80);
    QAbstractAnimation::start((DeletionPolicy)this_00);
  }
LAB_003906bf:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetAnimator::animate(QWidget *widget, const QRect &_final_geometry, bool animate)
{
    QRect r = widget->geometry();
    if (r.right() < 0 || r.bottom() < 0)
        r = QRect();

    animate = animate && !r.isNull() && !_final_geometry.isNull();

    // might make the widget go away by sending it to negative space
    const QRect final_geometry = _final_geometry.isValid() || widget->isWindow() ? _final_geometry :
        QRect(QPoint(-500 - widget->width(), -500 - widget->height()), widget->size());

#if QT_CONFIG(animation)
    //If the QStyle has animations, animate
    if (const int animationDuration = widget->style()->styleHint(QStyle::SH_Widget_Animation_Duration, nullptr, widget)) {
        AnimationMap::const_iterator it = m_animation_map.constFind(widget);
        if (it != m_animation_map.constEnd() && (*it)->endValue().toRect() == final_geometry)
            return;

        QPropertyAnimation *anim = new QPropertyAnimation(widget, "geometry", widget);
        anim->setDuration(animate ? animationDuration : 0);
        anim->setEasingCurve(QEasingCurve::InOutQuad);
        anim->setEndValue(final_geometry);
        m_animation_map[widget] = anim;
        connect(anim, &QPropertyAnimation::finished,
                this, &QWidgetAnimator::animationFinished);
        anim->start(QPropertyAnimation::DeleteWhenStopped);
    } else
#endif // animation
    {
    //we do it in one shot
    widget->setGeometry(final_geometry);
#if QT_CONFIG(mainwindow)
    m_mainWindowLayout->animationFinished(widget);
#endif // QT_CONFIG(mainwindow)
    }
}